

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSamples
          (AsciiParser *this,string *type_name,TimeSamples *ts_out)

{
  StreamReader *pSVar1;
  bool bVar2;
  int iVar3;
  char sep;
  char nc;
  char c;
  double timeVal;
  TimeSamples ts;
  Value value;
  char local_83;
  char local_82;
  char local_81;
  double local_80;
  TimeSamples local_78;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  uint64_t local_38;
  
  local_78._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_78._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_78._dirty = false;
  local_78._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_78._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  bVar2 = Expect(this,'{');
  if (bVar2) {
    bVar2 = SkipWhitespaceAndNewline(this,true);
    if (bVar2) {
      do {
        pSVar1 = this->_sr;
        if ((pSVar1->length_ <= pSVar1->idx_) || (pSVar1->binary_[pSVar1->idx_] == '\0'))
        goto LAB_003eb009;
        bVar2 = Char1(this,&local_81);
        iVar3 = 1;
        if ((bVar2) && (iVar3 = 3, local_81 != '}')) {
          Rewind(this,1);
          bVar2 = ReadBasicType(this,&local_80);
          if (bVar2) {
            bVar2 = SkipWhitespace(this);
            iVar3 = 1;
            if (bVar2) {
              bVar2 = Expect(this,':');
              if (bVar2) {
                bVar2 = SkipWhitespace(this);
                if (bVar2) {
                  local_48._M_allocated_capacity =
                       (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
                  local_58._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  bVar2 = ParseTimeSampleValue(this,type_name,(Value *)local_58);
                  iVar3 = 1;
                  if (bVar2) {
                    bVar2 = SkipWhitespace(this);
                    if (bVar2) {
                      local_83 = '\0';
                      bVar2 = Char1(this,&local_83);
                      iVar3 = 1;
                      if (bVar2) {
                        if (local_83 != ',') {
                          if (local_83 == '}') {
                            tinyusdz::value::TimeSamples::add_sample
                                      (&local_78,local_80,(Value *)local_58);
                            iVar3 = 3;
                            goto LAB_003eafaf;
                          }
                          Rewind(this,1);
                          local_38 = CurrLoc(this);
                          bVar2 = SkipWhitespaceAndNewline(this,true);
                          if (bVar2) {
                            bVar2 = Char1(this,&local_82);
                            iVar3 = 0;
                            if (bVar2) {
                              bVar2 = true;
                              if (local_82 == '}') {
                                tinyusdz::value::TimeSamples::add_sample
                                          (&local_78,local_80,(Value *)local_58);
                                iVar3 = 3;
                                goto LAB_003eaf91;
                              }
                            }
                            else {
                              iVar3 = 1;
LAB_003eaf91:
                              bVar2 = false;
                            }
                            if (bVar2) goto LAB_003eaf97;
                          }
                          else {
LAB_003eaf97:
                            SeekTo(this,local_38);
                            iVar3 = 0;
                          }
                          if (iVar3 != 0) goto LAB_003eafaf;
                        }
                        iVar3 = 0;
                      }
LAB_003eafaf:
                      if (iVar3 == 0) {
                        iVar3 = 1;
                        bVar2 = SkipWhitespaceAndNewline(this,true);
                        if (bVar2) {
                          tinyusdz::value::TimeSamples::add_sample
                                    (&local_78,local_80,(Value *)local_58);
                          iVar3 = 0;
                        }
                      }
                    }
                  }
                  if ((pointer)local_48._M_allocated_capacity != (pointer)0x0) {
                    (**(code **)(local_48._M_allocated_capacity + 0x20))((string *)local_58);
                    local_48._M_allocated_capacity = 0;
                  }
                }
              }
            }
          }
          else {
            local_58._0_8_ = &local_48;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_58,"Parse time value failed.","");
            PushError(this,(string *)local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._0_8_ != &local_48) {
              operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
            }
            iVar3 = 1;
          }
        }
      } while (iVar3 == 0);
      if (iVar3 == 3) {
LAB_003eb009:
        bVar2 = true;
        if (ts_out != (TimeSamples *)0x0) {
          local_58._0_8_ =
               (ts_out->_samples).
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_58._8_8_ =
               (ts_out->_samples).
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_48._M_allocated_capacity =
               (size_type)
               (ts_out->_samples).
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (ts_out->_samples).
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_78._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (ts_out->_samples).
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)CONCAT71(local_78._samples.
                                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                 local_78._samples.
                                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_1_);
          (ts_out->_samples).
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT71(local_78._samples.
                                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 local_78._samples.
                                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
          local_78._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_78._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          local_78._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_78._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_58);
          ts_out->_dirty = local_78._dirty;
        }
        goto LAB_003eb076;
      }
    }
  }
  bVar2 = false;
LAB_003eb076:
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector(&local_78._samples);
  return bVar2;
}

Assistant:

bool AsciiParser::ParseTimeSamples(const std::string &type_name,
                                   value::TimeSamples *ts_out) {

  value::TimeSamples ts;

  if (!Expect('{')) {
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      break;
    }

    Rewind(1);

    double timeVal;
    // -inf, inf and nan are handled.
    if (!ReadBasicType(&timeVal)) {
      PushError("Parse time value failed.");
      return false;
    }

    if (!SkipWhitespace()) {
      return false;
    }

    if (!Expect(':')) {
      return false;
    }

    if (!SkipWhitespace()) {
      return false;
    }

    value::Value value;
    if (!ParseTimeSampleValue(type_name, &value)) { // could be None(ValueBlock)
      return false;
    }

    // The last element may have separator ','
    {
      // Semicolon ';' is not allowed as a separator for timeSamples array
      // values.
      if (!SkipWhitespace()) {
        return false;
      }

      char sep{};
      if (!Char1(&sep)) {
        return false;
      }

      DCOUT("sep = " << sep);
      if (sep == '}') {
        // End of item
        ts.add_sample(timeVal, value);
        break;
      } else if (sep == ',') {
        // ok
      } else {
        Rewind(1);

        // Look ahead Newline + '}'
        auto loc = CurrLoc();

        if (SkipWhitespaceAndNewline()) {
          char nc;
          if (!Char1(&nc)) {
            return false;
          }

          if (nc == '}') {
            // End of item
            ts.add_sample(timeVal, value);
            break;
          }
        }

        // Rewind and continue parsing.
        SeekTo(loc);
      }
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    ts.add_sample(timeVal, value);
  }

  DCOUT("Parse TimeSamples success. # of items = " << ts.size());

  if (ts_out) {
    (*ts_out) = std::move(ts);
  }

  return true;
}